

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0762::Utf8Test_Proto3FieldValidates_Test::TestBody
          (Utf8Test_Proto3FieldValidates_Test *this)

{
  bool bVar1;
  upb_Arena *puVar2;
  char *pcVar3;
  upb_test_TestUtf8Proto3String *msg_00;
  AssertHelper local_78;
  Message local_70;
  anon_enum_32 local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  upb_DecodeStatus status;
  upb_test_TestUtf8Proto3String *msg;
  char *data;
  size_t size;
  Arena arena;
  Utf8Test_Proto3FieldValidates_Test *this_local;
  
  arena.ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
  super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
  super__Head_base<0UL,_upb_Arena_*,_false>._M_head_impl = (upb_Arena *)this;
  upb::Arena::Arena((Arena *)&size);
  puVar2 = upb::Arena::ptr((Arena *)&size);
  pcVar3 = GetBadUtf8Payload(puVar2,(size_t *)&data);
  puVar2 = upb::Arena::ptr((Arena *)&size);
  msg_00 = upb_test_TestUtf8Proto3String_new(puVar2);
  puVar2 = upb::Arena::ptr((Arena *)&size);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ =
       upb_Decode(pcVar3,(size_t)data,&msg_00->base_dont_copy_me__upb_internal_use_only,
                  &upb_0test__TestUtf8Proto3String_msg_init,(upb_ExtensionRegistry *)0x0,0,puVar2);
  local_64 = JD_NUMBER;
  testing::internal::EqHelper::Compare<upb_DecodeStatus,_upb_DecodeStatus,_nullptr>
            ((EqHelper *)local_60,"kUpb_DecodeStatus_BadUtf8","status",&local_64,
             (anon_enum_32 *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/utf8_test.cc"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  upb::Arena::~Arena((Arena *)&size);
  return;
}

Assistant:

TEST(Utf8Test, Proto3FieldValidates) {
  upb::Arena arena;
  size_t size;
  char* data = GetBadUtf8Payload(arena.ptr(), &size);

  upb_test_TestUtf8Proto3String* msg =
      upb_test_TestUtf8Proto3String_new(arena.ptr());

  upb_DecodeStatus status = upb_Decode(
      data, size, UPB_UPCAST(msg), &upb_0test__TestUtf8Proto3String_msg_init,
      nullptr, 0, arena.ptr());

  // Parse fails, because proto3 string fields validate UTF-8.
  ASSERT_EQ(kUpb_DecodeStatus_BadUtf8, status);
}